

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

bool __thiscall slang::parsing::isSameTokenList(parsing *this,TokenList *left,TokenList *right)

{
  long lVar1;
  long lVar2;
  Token right_00;
  Token left_00;
  bool bVar3;
  undefined8 in_RAX;
  Info *unaff_RBX;
  undefined8 unaff_R12;
  long lVar4;
  Info *unaff_R14;
  
  if (*(TokenList **)(this + 0x30) != right) {
    return false;
  }
  if (right != (TokenList *)0x0) {
    lVar2 = *(long *)(this + 0x28);
    lVar4 = 0;
    do {
      left_00.info = unaff_R14;
      left_00.kind = (short)unaff_R12;
      left_00._2_1_ = (char)((ulong)unaff_R12 >> 0x10);
      left_00.numFlags.raw = (char)((ulong)unaff_R12 >> 0x18);
      left_00.rawLen = (int)((ulong)unaff_R12 >> 0x20);
      right_00.info = unaff_RBX;
      right_00.kind = (short)in_RAX;
      right_00._2_1_ = (char)((ulong)in_RAX >> 0x10);
      right_00.numFlags.raw = (char)((ulong)in_RAX >> 0x18);
      right_00.rawLen = (int)((ulong)in_RAX >> 0x20);
      bVar3 = isSameToken(left_00,right_00);
      if (!bVar3) {
        return bVar3;
      }
      lVar1 = lVar2 + lVar4;
      lVar4 = lVar4 + 0x10;
    } while (lVar1 + 0x10 != *(long *)(this + 0x30) * 0x10 + *(long *)(this + 0x28));
    return bVar3;
  }
  return true;
}

Assistant:

static bool isSameTokenList(const TokenList& left, const TokenList& right) {
    if (left.size() != right.size())
        return false;

    for (auto lit = left.begin(), rit = right.begin(); lit != left.end(); lit++, rit++) {
        if (!isSameToken(*lit, *rit))
            return false;
    }
    return true;
}